

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

Constant * __thiscall LLVMBC::ConstantAggregate::getOperand(ConstantAggregate *this,uint index)

{
  Constant *this_00;
  LoggingCallback p_Var1;
  void *pvVar2;
  ulong uVar3;
  char acStack_1018 [4104];
  
  for (this_00 = (Constant *)
                 (this->elements).
                 super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[index];
      (this_00 != (Constant *)0x0 && ((this_00->super_Value).kind == Proxy));
      this_00 = (Constant *)ValueProxy::get_proxy_value((ValueProxy *)this_00)) {
  }
  uVar3 = (ulong)(this_00->super_Value).kind;
  if ((uVar3 < 0x24) && ((0x800001f7aU >> (uVar3 & 0x3f) & 1) != 0)) {
    return this_00;
  }
  p_Var1 = ::dxil_spv::get_thread_log_callback();
  if (p_Var1 == (LoggingCallback)0x0) {
    getOperand();
    std::terminate();
  }
  builtin_strncpy(acStack_1018 + 0x10,"in cast<T>.\n",0xd);
  builtin_strncpy(acStack_1018,"Invalid type ID ",0x10);
  pvVar2 = ::dxil_spv::get_thread_log_callback_userdata();
  (*p_Var1)(pvVar2,Error,acStack_1018);
  std::terminate();
}

Assistant:

Constant *ConstantAggregate::getOperand(unsigned index) const
{
	return cast<Constant>(elements[index]);
}